

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::AttribSpec::AttribSpec
          (AttribSpec *this,char *name_,Vec4 *p00_,Vec4 *p01_,Vec4 *p10_,Vec4 *p11_)

{
  allocator<char> local_39;
  Vec4 *local_38;
  Vec4 *p11__local;
  Vec4 *p10__local;
  Vec4 *p01__local;
  Vec4 *p00__local;
  char *name__local;
  AttribSpec *this_local;
  
  local_38 = p11_;
  p11__local = p10_;
  p10__local = p01_;
  p01__local = p00_;
  p00__local = (Vec4 *)name_;
  name__local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_39);
  std::allocator<char>::~allocator(&local_39);
  tcu::Vector<float,_4>::Vector(&this->p00,p01__local);
  tcu::Vector<float,_4>::Vector(&this->p01,p10__local);
  tcu::Vector<float,_4>::Vector(&this->p10,p11__local);
  tcu::Vector<float,_4>::Vector(&this->p11,local_38);
  return;
}

Assistant:

AttribSpec (const char* name_, const tcu::Vec4& p00_, const tcu::Vec4& p01_, const tcu::Vec4& p10_, const tcu::Vec4& p11_)
			: name		(name_)
			, p00		(p00_)
			, p01		(p01_)
			, p10		(p10_)
			, p11		(p11_)
		{
		}